

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ReflectionTester
          (ReflectionTester *this,Descriptor *base_descriptor)

{
  DescriptorPool *this_00;
  size_t sVar1;
  char *pcVar2;
  string *psVar3;
  pointer pcVar4;
  short *psVar5;
  int iVar6;
  FieldDescriptor *pFVar7;
  Descriptor *pDVar8;
  EnumValueDescriptor *pEVar9;
  AlphaNum *pAVar10;
  char *in_R9;
  pointer *__ptr;
  bool bVar11;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  AssertionResult gtest_ar_;
  AssertHelper local_c0;
  string local_b8;
  string local_98;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AlphaNum *local_38;
  
  this->base_descriptor_ = base_descriptor;
  pAVar10 = (AlphaNum *)base_descriptor->file_->package_;
  this_00 = base_descriptor->file_->pool_;
  sVar1 = (pAVar10->piece_)._M_len;
  pcVar2 = (pAVar10->piece_)._M_str;
  local_68 = (undefined1  [8])0x25;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e688;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name._M_str = local_b8._M_dataplus._M_p;
  name._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pDVar8 = FieldDescriptor::message_type(pFVar7);
  psVar3 = pDVar8->file_->package_;
  pAVar10 = (AlphaNum *)(psVar3->_M_dataplus)._M_p;
  pcVar4 = (pointer)psVar3->_M_string_length;
  local_68 = (undefined1  [8])0x1e;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e6ae;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  local_38 = pAVar10;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_00._M_str = local_b8._M_dataplus._M_p;
  name_00._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_00);
  this->nested_b_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0x11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e6cd;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_01._M_str = local_b8._M_dataplus._M_p;
  name_01._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_01);
  this->foreign_c_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_string_length = (size_type)local_38;
  local_68 = (undefined1  [8])0x10;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e6df;
  local_98._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_02._M_str = local_b8._M_dataplus._M_p;
  name_02._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_02);
  this->import_d_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_string_length = (size_type)local_38;
  local_68 = (undefined1  [8])0x16;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e6f0;
  local_98._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_03._M_str = local_b8._M_dataplus._M_p;
  name_03._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_03);
  this->import_e_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0x11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e707;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_04._M_str = local_b8._M_dataplus._M_p;
  name_04._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_04);
  this->nested_foo_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0x11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e719;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_05._M_str = local_b8._M_dataplus._M_p;
  name_05._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_05);
  this->nested_bar_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0x11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e72b;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_06._M_str = local_b8._M_dataplus._M_p;
  name_06._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_06);
  this->nested_baz_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0xc;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e73d;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_07._M_str = local_b8._M_dataplus._M_p;
  name_07._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_07);
  this->foreign_foo_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0xc;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e74a;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_08._M_str = local_b8._M_dataplus._M_p;
  name_08._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_08);
  this->foreign_bar_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0xc;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e757;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_09._M_str = local_b8._M_dataplus._M_p;
  name_09._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_09);
  this->foreign_baz_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_string_length = (size_type)local_38;
  local_68 = (undefined1  [8])0xb;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e764;
  local_98._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_10._M_str = local_b8._M_dataplus._M_p;
  name_10._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_10);
  this->import_foo_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_string_length = (size_type)local_38;
  local_68 = (undefined1  [8])0xb;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e770;
  local_98._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_11._M_str = local_b8._M_dataplus._M_p;
  name_11._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_11);
  this->import_bar_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_string_length = (size_type)local_38;
  local_68 = (undefined1  [8])0xb;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e77c;
  local_98._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_12._M_str = local_b8._M_dataplus._M_p;
  name_12._M_len = local_b8._M_string_length;
  pEVar9 = DescriptorPool::FindEnumValueByName(this_00,name_12);
  this->import_baz_ = pEVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  psVar5 = (short *)(this->base_descriptor_->all_names_).payload_;
  if (*psVar5 == 0x11) {
    iVar6 = bcmp(psVar5 + -9,"TestAllExtensions",0x11);
    if (iVar6 == 0) {
      local_68 = (undefined1  [8])0x1a;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e788;
      local_98._M_dataplus._M_p = pcVar2;
      local_98._M_string_length = sVar1;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
      name_15._M_str = local_b8._M_dataplus._M_p;
      name_15._M_len = local_b8._M_string_length;
      pFVar7 = DescriptorPool::FindFieldByName(this_00,name_15);
      this->group_a_ = pFVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_68 = (undefined1  [8])0x1a;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e7a3;
      local_98._M_dataplus._M_p = pcVar2;
      local_98._M_string_length = sVar1;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
      name_16._M_str = local_b8._M_dataplus._M_p;
      name_16._M_len = local_b8._M_string_length;
      pFVar7 = DescriptorPool::FindFieldByName(this_00,name_16);
      goto LAB_0063d1f3;
    }
  }
  local_68 = (undefined1  [8])0x1d;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e7be;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_13._M_str = local_b8._M_dataplus._M_p;
  name_13._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_13);
  this->group_a_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])0x1d;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e7dc;
  local_98._M_dataplus._M_p = pcVar2;
  local_98._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,pAVar10);
  name_14._M_str = local_b8._M_dataplus._M_p;
  name_14._M_len = local_b8._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_14);
LAB_0063d1f3:
  this->repeated_group_a_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar11 = this->group_a_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)0x112e803,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x96,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->repeated_group_a_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"repeated_group_a_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x97,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->nested_b_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"nested_b_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x98,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->foreign_c_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"foreign_c_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x99,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->import_d_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"import_d_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9a,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->import_e_ != (FieldDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"import_e_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9b,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->nested_foo_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"nested_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9c,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->nested_bar_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"nested_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9d,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->nested_baz_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"nested_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9e,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->foreign_foo_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"foreign_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9f,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->foreign_bar_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"foreign_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa0,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->foreign_baz_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"foreign_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa1,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->import_foo_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"import_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa2,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->import_bar_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"import_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa3,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  bVar11 = this->import_baz_ != (EnumValueDescriptor *)0x0;
  local_68[0] = bVar11;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_68,(AssertionResult *)"import_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa4,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

inline TestUtil::ReflectionTester::ReflectionTester(
    const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();
  const FieldDescriptor* import_descriptor = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.optional_import_message"));
  const absl::string_view import_package =
      import_descriptor->message_type()->file()->package();

  nested_b_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.NestedMessage.bb"));
  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  import_d_ =
      pool->FindFieldByName(absl::StrCat(import_package, ".ImportMessage.d"));
  import_e_ = pool->FindFieldByName(
      absl::StrCat(import_package, ".PublicImportMessage.e"));
  nested_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.FOO"));
  nested_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAR"));
  nested_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAZ"));
  foreign_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_FOO"));
  foreign_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAR"));
  foreign_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAZ"));
  import_foo_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_FOO"));
  import_bar_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAR"));
  import_baz_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAZ"));

  if (base_descriptor_->name() == "TestAllExtensions") {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".OptionalGroup_extension.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".RepeatedGroup_extension.a"));
  } else {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.OptionalGroup.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.RepeatedGroup.a"));
  }

  EXPECT_TRUE(group_a_ != nullptr);
  EXPECT_TRUE(repeated_group_a_ != nullptr);
  EXPECT_TRUE(nested_b_ != nullptr);
  EXPECT_TRUE(foreign_c_ != nullptr);
  EXPECT_TRUE(import_d_ != nullptr);
  EXPECT_TRUE(import_e_ != nullptr);
  EXPECT_TRUE(nested_foo_ != nullptr);
  EXPECT_TRUE(nested_bar_ != nullptr);
  EXPECT_TRUE(nested_baz_ != nullptr);
  EXPECT_TRUE(foreign_foo_ != nullptr);
  EXPECT_TRUE(foreign_bar_ != nullptr);
  EXPECT_TRUE(foreign_baz_ != nullptr);
  EXPECT_TRUE(import_foo_ != nullptr);
  EXPECT_TRUE(import_bar_ != nullptr);
  EXPECT_TRUE(import_baz_ != nullptr);
}